

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

void __thiscall QPDF::QPDF(QPDF *this)

{
  __atomic_base<unsigned_long_long> _Var1;
  _Head_base<0UL,_QPDF::Members_*,_false> this_00;
  
  this_00._M_head_impl = (Members *)operator_new(0x588);
  Members::Members(this_00._M_head_impl);
  (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = this_00._M_head_impl;
  ::qpdf::Tokenizer::allowEOF(&(this_00._M_head_impl)->tokenizer);
  LOCK();
  UNLOCK();
  _Var1._M_i = (QPDF::unique_id.super___atomic_base<unsigned_long_long>._M_i + 1)._M_i;
  ((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->unique_id =
       (unsigned_long_long)QPDF::unique_id.super___atomic_base<unsigned_long_long>._M_i;
  QPDF::unique_id.super___atomic_base<unsigned_long_long>._M_i =
       (__atomic_base<unsigned_long_long>)(__atomic_base<unsigned_long_long>)_Var1._M_i;
  return;
}

Assistant:

QPDF::QPDF() :
    m(std::make_unique<Members>())
{
    m->tokenizer.allowEOF();
    // Generate a unique ID. It just has to be unique among all QPDF objects allocated throughout
    // the lifetime of this running application.
    static std::atomic<unsigned long long> unique_id{0};
    m->unique_id = unique_id.fetch_add(1ULL);
}